

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

void set_storage_class(dmr_C *C,position *pos,decl_state *ctx,int klass)

{
  char *fmt;
  position pos_00;
  
  if ((klass - 6U < 0xfffffffe) && (ctx->is_tls != '\0')) {
    pos_00 = *pos;
    fmt = "__thread can only be used alone, or with extern or static";
  }
  else {
    if (ctx->storage_class == 0) {
      ctx->storage_class = (uchar)klass;
      return;
    }
    if ((uint)ctx->storage_class == klass) {
      dmrC_sparse_error(C,*pos,"duplicate %s",storage_class[(uint)klass]);
      return;
    }
    pos_00 = *pos;
    fmt = "multiple storage classes";
  }
  dmrC_sparse_error(C,pos_00,fmt);
  return;
}

Assistant:

static void set_storage_class(struct dmr_C *C, struct position *pos, struct decl_state *ctx, int klass)
{
	/* __thread can be used alone, or with extern or static */
	if (ctx->is_tls && (klass != SStatic && klass != SExtern)) {
		dmrC_sparse_error(C, *pos, "__thread can only be used alone, or with "
				"extern or static");
		return;
	}

	if (!ctx->storage_class) {
		ctx->storage_class = klass;
		return;
	}
	if (ctx->storage_class == klass)
		dmrC_sparse_error(C, *pos, "duplicate %s", storage_class[klass]);
	else
		dmrC_sparse_error(C, *pos, "multiple storage classes");
}